

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

int4 __thiscall TypeCode::compareBasic(TypeCode *this,TypeCode *op)

{
  type_metatype tVar1;
  type_metatype tVar2;
  FuncProto *pFVar3;
  FuncProto *pFVar4;
  ProtoModel *pPVar5;
  ProtoModel *pPVar6;
  size_t __n;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  iVar8 = (this->super_Datatype).size;
  iVar9 = (op->super_Datatype).size;
  if (iVar8 != iVar9) {
    return (uint)(iVar8 <= iVar9) * 2 + -1;
  }
  tVar1 = (op->super_Datatype).metatype;
  tVar2 = (this->super_Datatype).metatype;
  if (tVar2 == tVar1) {
    pFVar3 = this->proto;
    pFVar4 = op->proto;
    if (pFVar3 == (FuncProto *)0x0) {
      return (uint)(pFVar4 != (FuncProto *)0x0);
    }
    if (pFVar4 == (FuncProto *)0x0) {
      return -1;
    }
    pPVar5 = pFVar3->model;
    pPVar6 = pFVar4->model;
    if (pPVar5 == (ProtoModel *)0x0) {
      if (pPVar6 != (ProtoModel *)0x0) {
        return 1;
      }
    }
    else {
      if (pPVar6 == (ProtoModel *)0x0) {
        return -1;
      }
      __n = (pPVar5->name)._M_string_length;
      if ((__n != (pPVar6->name)._M_string_length) ||
         ((__n != 0 &&
          (iVar8 = bcmp((pPVar5->name)._M_dataplus._M_p,(pPVar6->name)._M_dataplus._M_p,__n),
          iVar8 != 0)))) {
        iVar8 = std::__cxx11::string::compare((string *)&pPVar5->name);
        return iVar8 >> 0x1f | 1;
      }
    }
    iVar8 = (*pFVar3->store->_vptr_ProtoStore[5])();
    iVar9 = (*op->proto->store->_vptr_ProtoStore[5])();
    if (iVar8 == iVar9) {
      uVar10 = this->proto->flags & 0x1c01;
      uVar11 = op->proto->flags & 0x1c01;
      if (uVar10 == uVar11) {
        return 2;
      }
      return -(uint)(uVar10 < uVar11) | 1;
    }
    bVar7 = iVar8 <= iVar9;
  }
  else {
    bVar7 = (int)tVar1 <= (int)tVar2;
  }
  return (uint)bVar7 * 2 + -1;
}

Assistant:

int4 TypeCode::compareBasic(const TypeCode *op) const

{
  if (size != op->getSize()) return (op->getSize() < size) ? -1 : 1;
  if (metatype != op->getMetatype()) return (metatype < op->getMetatype()) ? -1 : 1;

  if (proto == (FuncProto *)0) {
    if (op->proto == (FuncProto *)0) return 0;
    return 1;
  }
  if (op->proto == (FuncProto *)0)
    return -1;

  if (!proto->hasModel()) {
    if (op->proto->hasModel()) return 1;
  }
  else {
    if (!op->proto->hasModel()) return -1;
    const string &model1(proto->getModelName());
    const string &model2(op->proto->getModelName());
    if (model1 != model2)
      return (model1 < model2) ? -1 : 1;
  }
  int4 nump = proto->numParams();
  int4 opnump = op->proto->numParams();
  if (nump != opnump)
    return (opnump < nump) ? -1 : 1;
  uint4 flags = proto->getComparableFlags();
  uint4 opflags = op->proto->getComparableFlags();
  if (flags != opflags)
    return (flags < opflags) ? -1 : 1;

  return 2;			// Carry on with comparison of parameters
}